

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O1

void m68k_op_muls_16_d(void)

{
  ulong uVar1;
  
  uVar1 = (ulong)(m68ki_cpu.ir >> 7 & 0x1c);
  m68ki_cpu.not_z_flag =
       (int)*(short *)((long)m68ki_cpu.dar + uVar1) * (int)(short)m68ki_cpu.dar[m68ki_cpu.ir & 7];
  *(uint *)((long)m68ki_cpu.dar + uVar1) = m68ki_cpu.not_z_flag;
  m68ki_cpu.n_flag = m68ki_cpu.not_z_flag >> 0x18;
  m68ki_cpu.v_flag = 0;
  m68ki_cpu.c_flag = 0;
  return;
}

Assistant:

static void m68k_op_muls_16_d(void)
{
	uint* r_dst = &DX;
	uint res = MASK_OUT_ABOVE_32(MAKE_INT_16(DY) * MAKE_INT_16(MASK_OUT_ABOVE_16(*r_dst)));

	*r_dst = res;

	FLAG_Z = res;
	FLAG_N = NFLAG_32(res);
	FLAG_V = VFLAG_CLEAR;
	FLAG_C = CFLAG_CLEAR;
}